

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::compiler::Compiler::Node_*>::dispose
          (ArrayBuilder<capnp::compiler::Compiler::Node_*> *this)

{
  Node **ppNVar1;
  RemoveConst<capnp::compiler::Compiler::Node_*> *ppNVar2;
  Node **ppNVar3;
  
  ppNVar1 = this->ptr;
  if (ppNVar1 != (Node **)0x0) {
    ppNVar2 = this->pos;
    ppNVar3 = this->endPtr;
    this->endPtr = (Node **)0x0;
    this->ptr = (Node **)0x0;
    this->pos = (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppNVar1,8,(long)ppNVar2 - (long)ppNVar1 >> 3,
               (long)ppNVar3 - (long)ppNVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }